

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<Clause_*>_>::~vec(vec<vec<Clause_*>_> *this)

{
  vec<Clause_*> *pvVar1;
  void *__ptr;
  long lVar2;
  ulong uVar3;
  
  if (this->sz != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      pvVar1 = this->data;
      __ptr = *(void **)((long)&pvVar1->sz + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      *(undefined8 *)((long)&pvVar1->sz + lVar2) = 0;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < this->sz);
  }
  if (this->data != (vec<Clause_*> *)0x0) {
    free(this->data);
  }
  this->data = (vec<Clause_*> *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}